

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

bool __thiscall wasm::WasmValidator::validate(WasmValidator *this,Module *module,Flags flags)

{
  __node_base_ptr *__k;
  string_view *psVar1;
  __uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_> _Var2;
  value_type pGVar3;
  long lVar4;
  long lVar5;
  Type left;
  __buckets_ptr pp_Var6;
  __node_base_ptr p_Var7;
  undefined8 *puVar8;
  pointer puVar9;
  uintptr_t *puVar10;
  pointer puVar11;
  byte bVar12;
  string_view curr_00;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar13;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar14;
  Name curr_01;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar15;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar16;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar17;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *puVar18;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *puVar19;
  bool bVar20;
  FeatureSet FVar21;
  uint uVar22;
  int iVar23;
  Type *pTVar24;
  __node_base_ptr p_Var25;
  Tuple *pTVar26;
  Function *pFVar27;
  Global *pGVar28;
  size_type sVar29;
  ostringstream *poVar30;
  ostream *poVar31;
  size_type sVar32;
  long lVar33;
  Memory *pMVar34;
  Table *pTVar35;
  Function *pFVar36;
  size_type sVar37;
  iterator iVar38;
  Expression *pEVar39;
  char *pcVar40;
  __node_base_ptr *pp_Var41;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *import_1;
  pointer puVar42;
  unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *curr;
  Function *pFVar43;
  undefined8 *puVar44;
  uintptr_t *puVar45;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *memory;
  __node_base_ptr p_Var46;
  pointer puVar47;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *segment_1;
  bool result;
  Name name;
  Name name_00;
  Signature SVar48;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar49;
  Name name_01;
  undefined1 local_4a0 [8];
  PassRunner runner;
  Iterator __begin3;
  __node_base a_Stack_358 [16];
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  long lStack_2c0;
  Module *local_2b8;
  undefined1 *local_2b0;
  Task *local_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined4 local_288;
  undefined8 local_280;
  Task aTStack_278 [18];
  _Alloc_hider local_158;
  Type funcref;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  _Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_118;
  undefined1 local_100 [8];
  ValidationInfo info;
  HeapType type;
  Type externref;
  __node_base_ptr p_Stack_58;
  Function *local_50;
  Function *local_48;
  Function *local_40;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *import;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range1;
  
  info.mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  info.validateWeb = false;
  info.validateGlobally = false;
  info.quiet = false;
  info.closedWorld = false;
  info.valid._M_base._M_i = (__atomic_base<bool>)0x0;
  info._13_3_ = 0;
  info.mutex.super___mutex_base._M_mutex.__align = 0;
  info.mutex.super___mutex_base._M_mutex._8_8_ = 0;
  info.mutex.super___mutex_base._M_mutex._16_8_ = 0;
  info.mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)&info.outputs._M_h._M_rehash_policy._M_next_resize;
  info.outputs._M_h._M_buckets = (__buckets_ptr)0x1;
  info.outputs._M_h._M_bucket_count = 0;
  info.outputs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  info.outputs._M_h._M_element_count._0_4_ = 0x3f800000;
  info.outputs._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  info.outputs._M_h._M_rehash_policy._4_4_ = 0;
  info.outputs._M_h._M_rehash_policy._M_next_resize = 0;
  LOCK();
  info.wasm._4_1_ = 1;
  UNLOCK();
  bVar12 = (byte)flags;
  info.wasm._0_1_ = bVar12 & 1;
  info.wasm._1_1_ = bVar12 >> 1 & 1;
  info.wasm._2_1_ = (byte)(flags >> 2) & 1;
  info.wasm._3_1_ = bVar12 >> 3 & 1;
  local_100 = (undefined1  [8])module;
  PassRunner::PassRunner((PassRunner *)local_4a0,module);
  FunctionValidator::FunctionValidator
            ((FunctionValidator *)&runner.skippedPasses._M_h._M_single_bucket,module,
             (ValidationInfo *)local_100);
  FunctionValidator::validate
            ((FunctionValidator *)&runner.skippedPasses._M_h._M_single_bucket,
             (PassRunner *)local_4a0);
  FunctionValidator::~FunctionValidator
            ((FunctionValidator *)&runner.skippedPasses._M_h._M_single_bucket);
  import = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)module;
  if (info.wasm._1_1_ == 1) {
    local_50 = (Function *)
               (module->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    pp_Var41 = &runner.skippedPasses._M_h._M_single_bucket;
    pFVar27 = (Function *)
              (module->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    while (pFVar27 != local_50) {
      pFVar43 = (Function *)(pFVar27->super_Importable).super_Named.name.super_IString.str._M_len;
      local_40 = pFVar27;
      if (*(char **)((long)&(pFVar43->super_Importable).module + 8) != (char *)0x0) {
        local_48 = (Function *)&pFVar43->type;
        SVar48 = HeapType::getSignature((HeapType *)local_48);
        runner.skippedPasses._M_h._M_single_bucket = (__node_base_ptr)SVar48.results.id;
        bVar20 = wasm::Type::isTuple((Type *)pp_Var41);
        if (bVar20) {
          ValidationInfo::shouldBeTrue<wasm::Name>
                    ((ValidationInfo *)local_100,
                     (bool)((byte)(*(uint *)&import[0x21]._M_t.
                                             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                             .super__Head_base<0UL,_wasm::Function_*,_false>.
                                             _M_head_impl >> 9) & 1),
                     (IString)*(IString *)&(pFVar43->super_Importable).super_Named,
                     "Imported multivalue function requires multivalue [--enable-multivalue]",
                     (Function *)0x0);
        }
        if ((byte)info.wasm == 1) {
          SVar48 = HeapType::getSignature((HeapType *)local_48);
          type.id = (uintptr_t)SVar48.params.id;
          runner.skippedPasses._M_h._M_single_bucket = (__node_base_ptr)&type;
          __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)0x0;
          PVar49 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
                   wasm::Type::end((Type *)runner.skippedPasses._M_h._M_single_bucket);
          p_Var25 = (__node_base_ptr)&type;
          for (; PVar13.index = (size_t)__begin3.
                                        super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                        .parent, PVar13.parent = (Type *)p_Var25, PVar49 != PVar13;
              __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                   (Type *)((long)&(__begin3.
                                    super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                   .parent)->id + 1)) {
            pTVar24 = wasm::Type::Iterator::operator*((Iterator *)pp_Var41);
            ValidationInfo::shouldBeUnequal<wasm::Name,wasm::Type>
                      ((ValidationInfo *)local_100,(Type)pTVar24->id,(Type)0x3,
                       (IString)*(IString *)&(pFVar43->super_Importable).super_Named,
                       "Imported function must not have i64 parameters",(Function *)0x0);
            p_Var25 = runner.skippedPasses._M_h._M_single_bucket;
          }
          SVar48 = HeapType::getSignature((HeapType *)local_48);
          type.id = (uintptr_t)SVar48.results.id;
          runner.skippedPasses._M_h._M_single_bucket = (__node_base_ptr)&type;
          __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)0x0;
          PVar49 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
                   wasm::Type::end((Type *)runner.skippedPasses._M_h._M_single_bucket);
          p_Var25 = (__node_base_ptr)&type;
          for (; PVar14.index = (size_t)__begin3.
                                        super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                        .parent, PVar14.parent = (Type *)p_Var25, PVar49 != PVar14;
              __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                   (Type *)((long)&(__begin3.
                                    super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                   .parent)->id + 1)) {
            pTVar24 = wasm::Type::Iterator::operator*((Iterator *)pp_Var41);
            ValidationInfo::shouldBeUnequal<wasm::Name,wasm::Type>
                      ((ValidationInfo *)local_100,(Type)pTVar24->id,(Type)0x3,
                       (IString)*(IString *)&(pFVar43->super_Importable).super_Named,
                       "Imported function must not have i64 results",(Function *)0x0);
            p_Var25 = runner.skippedPasses._M_h._M_single_bucket;
          }
        }
        runner.skippedPasses._M_h._M_single_bucket = (__node_base_ptr)import;
        bVar20 = Intrinsics::isCallWithoutEffects((Intrinsics *)pp_Var41,pFVar43);
        if (bVar20) {
          SVar48 = HeapType::getSignature((HeapType *)local_48);
          runner.skippedPasses._M_h._M_single_bucket = (__node_base_ptr)SVar48.params.id;
          bVar20 = wasm::Type::isTuple((Type *)pp_Var41);
          if (bVar20) {
            pTVar26 = wasm::Type::getTuple((Type *)pp_Var41);
            runner.skippedPasses._M_h._M_single_bucket =
                 (__node_base_ptr)
                 (pTVar26->types).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                 _M_impl.super__Vector_impl_data._M_finish[-1].id;
          }
          bVar20 = wasm::Type::isFunction((Type *)pp_Var41);
          ValidationInfo::shouldBeTrue<wasm::Name>
                    ((ValidationInfo *)local_100,bVar20,
                     (IString)*(IString *)&(pFVar43->super_Importable).super_Named,
                     "call.if.used\'s last param must be a function",(Function *)0x0);
        }
      }
      pFVar27 = (Function *)&(local_40->super_Importable).super_Named.name.super_IString.str._M_str;
    }
    pFVar43 = import[7]._M_t.
              super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
              super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    for (pFVar27 = import[6]._M_t.
                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl; pFVar27 != pFVar43;
        pFVar27 = (Function *)((long)&(pFVar27->super_Importable).super_Named.name + 8)) {
      psVar1 = *(string_view **)&(pFVar27->super_Importable).super_Named.name;
      if (psVar1[2]._M_len != 0) {
        if (((ulong)import[0x21]._M_t.
                    super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t
                    .super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl & 2) == 0) {
          ValidationInfo::shouldBeFalse<wasm::Name>
                    ((ValidationInfo *)local_100,*(bool *)&psVar1[4]._M_str,(Name)*psVar1,
                     "Imported mutable global requires mutable-globals [--enable-mutable-globals]",
                     (Function *)0x0);
        }
        bVar20 = wasm::Type::isTuple((Type *)&psVar1[3]._M_str);
        ValidationInfo::shouldBeFalse<wasm::Name>
                  ((ValidationInfo *)local_100,bVar20,(Name)*psVar1,
                   "Imported global cannot be tuple",(Function *)0x0);
      }
    }
    local_48 = import[1]._M_t.
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    pFVar27 = (import->_M_t).
              super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
              super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    while (pFVar27 != local_48) {
      _Var2._M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
      super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
           *(tuple<wasm::Function_*,_std::default_delete<wasm::Function>_> *)
            &(pFVar27->super_Importable).super_Named.name;
      local_40 = pFVar27;
      if (*(int *)((long)_Var2._M_t.
                         super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                         .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x20) == 3)
      {
        pGVar28 = Module::getGlobalOrNull
                            ((Module *)import,
                             (Name)((IString *)
                                   ((long)_Var2._M_t.
                                          super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                          .super__Head_base<0UL,_wasm::Function_*,_false>.
                                          _M_head_impl + 0x10))->str);
        if (pGVar28 != (Global *)0x0) {
          if (((ulong)import[0x21]._M_t.
                      super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                      .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl & 2) == 0) {
            ValidationInfo::shouldBeFalse<wasm::Name>
                      ((ValidationInfo *)local_100,pGVar28->mutable_,
                       (Name)(pGVar28->super_Importable).super_Named.name.super_IString.str,
                       "Exported mutable global requires mutable-globals [--enable-mutable-globals]"
                       ,(Function *)0x0);
          }
          bVar20 = wasm::Type::isTuple(&pGVar28->type);
          ValidationInfo::shouldBeFalse<wasm::Name>
                    ((ValidationInfo *)local_100,bVar20,
                     (Name)(pGVar28->super_Importable).super_Named.name.super_IString.str,
                     "Exported global cannot be tuple",(Function *)0x0);
        }
      }
      else if ((*(int *)((long)_Var2._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x20)
                == 0) && ((byte)info.wasm == 1)) {
        pFVar27 = Module::getFunction((Module *)import,
                                      (Name)((IString *)
                                            ((long)_Var2._M_t.
                                                                                                      
                                                  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                                  .super__Head_base<0UL,_wasm::Function_*,_false>.
                                                  _M_head_impl + 0x10))->str);
        local_50 = (Function *)&pFVar27->type;
        SVar48 = HeapType::getSignature((HeapType *)local_50);
        type.id = (uintptr_t)SVar48.params.id;
        runner.skippedPasses._M_h._M_single_bucket = (__node_base_ptr)&type;
        __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)0x0;
        PVar49 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
                 wasm::Type::end((Type *)runner.skippedPasses._M_h._M_single_bucket);
        for (; PVar15.index = (size_t)__begin3.
                                      super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                      .parent,
            PVar15.parent = (Type *)runner.skippedPasses._M_h._M_single_bucket, PVar49 != PVar15;
            __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                 (Type *)((long)&(__begin3.
                                  super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                 .parent)->id + 1)) {
          pTVar24 = wasm::Type::Iterator::operator*
                              ((Iterator *)&runner.skippedPasses._M_h._M_single_bucket);
          ValidationInfo::shouldBeUnequal<wasm::Name,wasm::Type>
                    ((ValidationInfo *)local_100,(Type)pTVar24->id,(Type)0x3,
                     (Name)(pFVar27->super_Importable).super_Named.name.super_IString.str,
                     "Exported function must not have i64 parameters",(Function *)0x0);
        }
        SVar48 = HeapType::getSignature((HeapType *)local_50);
        type.id = (uintptr_t)SVar48.results.id;
        runner.skippedPasses._M_h._M_single_bucket = (__node_base_ptr)&type;
        __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)0x0;
        PVar49 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
                 wasm::Type::end((Type *)runner.skippedPasses._M_h._M_single_bucket);
        for (; PVar16.index = (size_t)__begin3.
                                      super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                      .parent,
            PVar16.parent = (Type *)runner.skippedPasses._M_h._M_single_bucket, PVar49 != PVar16;
            __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                 (Type *)((long)&(__begin3.
                                  super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                 .parent)->id + 1)) {
          pTVar24 = wasm::Type::Iterator::operator*
                              ((Iterator *)&runner.skippedPasses._M_h._M_single_bucket);
          ValidationInfo::shouldBeUnequal<wasm::Name,wasm::Type>
                    ((ValidationInfo *)local_100,(Type)pTVar24->id,(Type)0x3,
                     (Name)(pFVar27->super_Importable).super_Named.name.super_IString.str,
                     "Exported function must not have i64 results",(Function *)0x0);
        }
      }
      pFVar27 = (Function *)
                ((long)&(local_40->super_Importable).super_Named.name.super_IString.str + 8);
    }
    runner.skippedPasses._M_h._M_single_bucket = a_Stack_358;
    a_Stack_358[0]._M_nxt = (_Hash_node_base *)0x0;
    pFVar43 = import[1]._M_t.
              super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
              super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    for (pFVar27 = (import->_M_t).
                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl; pFVar27 != pFVar43;
        pFVar27 = (Function *)((long)&(pFVar27->super_Importable).super_Named.name + 8)) {
      lVar33 = *(long *)&(pFVar27->super_Importable).super_Named.name;
      uVar22 = *(uint *)(lVar33 + 0x20);
      if (4 < uVar22) {
        handle_unreachable("invalid ExternalKind",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-validator.cpp"
                           ,0xcf0);
      }
      psVar1 = (string_view *)(lVar33 + 0x10);
      curr_00 = *psVar1;
      switch(uVar22) {
      case 0:
        pFVar36 = Module::getFunctionOrNull((Module *)import,(Name)*psVar1);
        pcVar40 = "module function exports must be found";
        break;
      case 1:
        pFVar36 = (Function *)Module::getTableOrNull((Module *)import,(Name)*psVar1);
        pcVar40 = "module table exports must be found";
        break;
      case 2:
        pFVar36 = (Function *)Module::getMemoryOrNull((Module *)import,(Name)*psVar1);
        pcVar40 = "module memory exports must be found";
        break;
      case 3:
        pFVar36 = (Function *)Module::getGlobalOrNull((Module *)import,(Name)*psVar1);
        pcVar40 = "module global exports must be found";
        break;
      case 4:
        pFVar36 = (Function *)Module::getTagOrNull((Module *)import,(Name)*psVar1);
        pcVar40 = "module tag exports must be found";
      }
      ValidationInfo::shouldBeTrue<wasm::Name>
                ((ValidationInfo *)local_100,pFVar36 != (Function *)0x0,(Name)curr_00,pcVar40,
                 (Function *)0x0);
      puVar45 = *(uintptr_t **)&(pFVar27->super_Importable).super_Named.name;
      type.id = *puVar45;
      pcVar40 = (char *)puVar45[1];
      sVar29 = std::
               _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        *)&runner.skippedPasses._M_h._M_single_bucket,(key_type *)&type);
      curr_01.super_IString.str._M_str = pcVar40;
      curr_01.super_IString.str._M_len = type.id;
      ValidationInfo::shouldBeFalse<wasm::Name>
                ((ValidationInfo *)local_100,sVar29 != 0,curr_01,"module exports must be unique",
                 (Function *)0x0);
      std::__detail::
      _Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::insert((_Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)&runner.skippedPasses._M_h._M_single_bucket,(key_type *)&type);
    }
    std::
    _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)&runner.skippedPasses._M_h._M_single_bucket);
    type.id = (uintptr_t)&p_Stack_58;
    p_Stack_58 = (__node_base_ptr)0x0;
    pFVar43 = import[7]._M_t.
              super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
              super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    local_40 = pFVar43;
    for (pFVar27 = import[6]._M_t.
                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        pp_Var41 = &runner.skippedPasses._M_h._M_single_bucket, pFVar27 != pFVar43;
        pFVar27 = (Function *)((long)&(pFVar27->super_Importable).super_Named.name + 8)) {
      pGVar3 = *(value_type *)&(pFVar27->super_Importable).super_Named.name;
      if ((pGVar3->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
        local_158._M_p = (pointer)pGVar3;
        FVar21 = wasm::Type::getFeatures(&pGVar3->type);
        ValidationInfo::shouldBeTrue<wasm::Name>
                  ((ValidationInfo *)local_100,
                   (FVar21.features &
                   ~*(uint *)&import[0x21]._M_t.
                              super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                              .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl) == 0,
                   (Name)(pGVar3->super_Importable).super_Named.name.super_IString.str,
                   "all used types should be allowed",(Function *)0x0);
        ValidationInfo::shouldBeTrue<wasm::Name>
                  ((ValidationInfo *)local_100,pGVar3->init != (Expression *)0x0,
                   (Name)(pGVar3->super_Importable).super_Named.name.super_IString.str,
                   "global init must be non-null",(Function *)0x0);
        if (pGVar3->init == (Expression *)0x0) {
          __assert_fail("curr->init",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-validator.cpp"
                        ,0xd02,
                        "auto wasm::validateGlobals(Module &, ValidationInfo &)::(anonymous class)::operator()(Global *) const"
                       );
        }
        bVar20 = GlobalUtils::canInitializeGlobal((Module *)import,pGVar3->init);
        ValidationInfo::shouldBeTrue<wasm::Name>
                  ((ValidationInfo *)local_100,bVar20,
                   (Name)(pGVar3->super_Importable).super_Named.name.super_IString.str,
                   "global init must be constant",(Function *)0x0);
        pEVar39 = pGVar3->init;
        bVar20 = ValidationInfo::shouldBeSubType
                           ((ValidationInfo *)local_100,(Type)(pEVar39->type).id,
                            (Type)(pGVar3->type).id,pEVar39,"global init must have correct type",
                            (Function *)0x0);
        if ((!bVar20) && (info.wasm._2_1_ == 0)) {
          poVar30 = ValidationInfo::getStream_abi_cxx11_
                              ((ValidationInfo *)local_100,(Function *)0x0);
          poVar31 = std::operator<<((ostream *)poVar30,"(on global ");
          name_01.super_IString.str._M_str = (char *)pEVar39;
          name_01.super_IString.str._M_len =
               (size_t)(pGVar3->super_Importable).super_Named.name.super_IString.str._M_str;
          poVar31 = wasm::operator<<((wasm *)poVar31,
                                     (ostream *)
                                     (pGVar3->super_Importable).super_Named.name.super_IString.str.
                                     _M_len,name_01);
          std::operator<<(poVar31,")\n");
        }
        FunctionValidator::FunctionValidator
                  ((FunctionValidator *)pp_Var41,(Module *)import,(ValidationInfo *)local_100);
        FunctionValidator::validate((FunctionValidator *)pp_Var41,pGVar3->init);
        FunctionValidator::~FunctionValidator((FunctionValidator *)pp_Var41);
        if ((((ulong)import[0x21]._M_t.
                     super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl & 0x400) != 0) &&
           (pGVar3->init != (Expression *)0x0)) {
          FindAll<wasm::GlobalGet>::FindAll((FindAll<wasm::GlobalGet> *)pp_Var41,pGVar3->init);
          for (p_Var25 = runner.skippedPasses._M_h._M_single_bucket; p_Var25 != (__node_base_ptr)0x1
              ; p_Var25 = p_Var25 + 1) {
            local_138._M_dataplus._M_p =
                 (pointer)Module::getGlobalOrNull
                                    ((Module *)import,
                                     (IString)*(IString *)&p_Var25->_M_nxt[2]._M_nxt);
            if ((Global *)local_138._M_dataplus._M_p == (Global *)0x0) {
              bVar20 = false;
            }
            else {
              sVar32 = std::
                       _Hashtable<wasm::Global_*,_wasm::Global_*,_std::allocator<wasm::Global_*>,_std::__detail::_Identity,_std::equal_to<wasm::Global_*>,_std::hash<wasm::Global_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       ::count((_Hashtable<wasm::Global_*,_wasm::Global_*,_std::allocator<wasm::Global_*>,_std::__detail::_Identity,_std::equal_to<wasm::Global_*>,_std::hash<wasm::Global_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                *)&type,(key_type *)&local_138);
              bVar20 = true;
              if (sVar32 == 0) {
                bVar20 = *(char **)(local_138._M_dataplus._M_p + 0x20) != (char *)0x0;
              }
            }
            ValidationInfo::shouldBeTrue<wasm::Expression*>
                      ((ValidationInfo *)local_100,bVar20,pGVar3->init,
                       "global initializer should only refer to previous globals",(Function *)0x0);
          }
          std::_Vector_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>::~_Vector_base
                    ((_Vector_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_> *)
                     &runner.skippedPasses._M_h._M_single_bucket);
          std::__detail::
          _Insert_base<wasm::Global_*,_wasm::Global_*,_std::allocator<wasm::Global_*>,_std::__detail::_Identity,_std::equal_to<wasm::Global_*>,_std::hash<wasm::Global_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::insert((_Insert_base<wasm::Global_*,_wasm::Global_*,_std::allocator<wasm::Global_*>,_std::__detail::_Identity,_std::equal_to<wasm::Global_*>,_std::hash<wasm::Global_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)&type,(value_type *)&stack0xfffffffffffffea8);
          pFVar43 = local_40;
        }
      }
    }
    std::
    _Hashtable<wasm::Global_*,_wasm::Global_*,_std::allocator<wasm::Global_*>,_std::__detail::_Identity,_std::equal_to<wasm::Global_*>,_std::hash<wasm::Global_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Global_*,_wasm::Global_*,_std::allocator<wasm::Global_*>,_std::__detail::_Identity,_std::equal_to<wasm::Global_*>,_std::hash<wasm::Global_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)&type);
    puVar18 = import;
    pFVar27 = import[0xf]._M_t.
              super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
              super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    pFVar43 = import[0x10]._M_t.
              super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
              super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    if (8 < (ulong)((long)pFVar43 - (long)pFVar27)) {
      ValidationInfo::shouldBeTrue<char_const*>
                ((ValidationInfo *)local_100,
                 (bool)((byte)((uint)*(undefined4 *)
                                      &import[0x21]._M_t.
                                       super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                       .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl
                              >> 0x10) & 1),"memory",
                 "multiple memories require multi-memories [--enable-multi-memories]",
                 (Function *)0x0);
      pFVar27 = puVar18[0xf]._M_t.
                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      pFVar43 = puVar18[0x10]._M_t.
                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    }
    for (; pFVar27 != pFVar43;
        pFVar27 = (Function *)
                  ((long)&(pFVar27->super_Importable).super_Named.name.super_IString + 8)) {
      lVar33 = *(long *)&(pFVar27->super_Importable).super_Named.name.super_IString;
      if (*(ulong *)(lVar33 + 0x40) != 0xffffffffffffffff) {
        ValidationInfo::shouldBeFalse<char_const*>
                  ((ValidationInfo *)local_100,*(ulong *)(lVar33 + 0x40) < *(ulong *)(lVar33 + 0x38)
                   ,"memory","memory max >= initial",(Function *)0x0);
        lVar33 = *(long *)&(pFVar27->super_Importable).super_Named.name.super_IString;
      }
      if (*(long *)(lVar33 + 0x50) == 3) {
        bVar20 = (bool)((*(byte *)((long)&import[0x21]._M_t.
                                          super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                          .super__Head_base<0UL,_wasm::Function_*,_false>.
                                          _M_head_impl + 1) & 8) >> 3);
        pcVar40 = "64-bit memories require memory64 [--enable-memory64]";
      }
      else {
        ValidationInfo::shouldBeTrue<char_const*>
                  ((ValidationInfo *)local_100,*(ulong *)(lVar33 + 0x38) < 0x10001,"memory",
                   "initial memory must be <= 4GB",(Function *)0x0);
        bVar20 = *(long *)(*(long *)&(pFVar27->super_Importable).super_Named.name.super_IString +
                          0x40) + 1U < 0x10002;
        pcVar40 = "max memory must be <= 4GB, or unlimited";
      }
      ValidationInfo::shouldBeTrue<char_const*>
                ((ValidationInfo *)local_100,bVar20,"memory",pcVar40,(Function *)0x0);
      lVar33 = *(long *)&(pFVar27->super_Importable).super_Named.name.super_IString;
      bVar20 = true;
      if (*(char *)(lVar33 + 0x48) == '\x01') {
        bVar20 = *(long *)(lVar33 + 0x40) != -1;
      }
      ValidationInfo::shouldBeTrue<char_const*>
                ((ValidationInfo *)local_100,bVar20,"memory","shared memory must have max size",
                 (Function *)0x0);
      if (*(char *)(*(long *)&(pFVar27->super_Importable).super_Named.name.super_IString + 0x48) ==
          '\x01') {
        ValidationInfo::shouldBeTrue<char_const*>
                  ((ValidationInfo *)local_100,
                   (bool)((byte)*(undefined4 *)
                                 &import[0x21]._M_t.
                                  super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                  .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl & 1),
                   "memory","shared memory requires threads [--enable-threads]",(Function *)0x0);
      }
    }
    pFVar43 = import[0x13]._M_t.
              super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
              super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    for (pFVar27 = import[0x12]._M_t.
                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl; puVar18 = import,
        pFVar27 != pFVar43;
        pFVar27 = (Function *)((long)&(pFVar27->super_Importable).super_Named.name + 8)) {
      lVar33 = *(long *)&(pFVar27->super_Importable).super_Named.name;
      if (*(char *)(lVar33 + 0x28) == '\x01') {
        ValidationInfo::shouldBeTrue<wasm::Expression*>
                  ((ValidationInfo *)local_100,
                   SUB41((*(uint *)&import[0x21]._M_t.
                                    super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                    .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl &
                         0x10) >> 4,0),*(Expression **)(lVar33 + 0x30),
                   "nonzero segment flags require bulk memory [--enable-bulk-memory]",
                   (Function *)0x0);
        pEVar39 = *(Expression **)(*(long *)&(pFVar27->super_Importable).super_Named.name + 0x30);
        ValidationInfo::shouldBeEqual<wasm::Expression*,wasm::Expression*>
                  ((ValidationInfo *)local_100,pEVar39,(Expression *)0x0,pEVar39,
                   "passive segment should not have an offset",(Function *)0x0);
      }
      else {
        lVar4 = *(long *)(lVar33 + 0x40);
        lVar5 = *(long *)(lVar33 + 0x38);
        pMVar34 = Module::getMemoryOrNull((Module *)import,(Name)((IString *)(lVar33 + 0x18))->str);
        bVar20 = ValidationInfo::shouldBeTrue<char_const*>
                           ((ValidationInfo *)local_100,pMVar34 != (Memory *)0x0,"segment",
                            "active segment must have a valid memory name",(Function *)0x0);
        if (bVar20) {
          pEVar39 = *(Expression **)(*(long *)&(pFVar27->super_Importable).super_Named.name + 0x30);
          left.id = (pEVar39->type).id;
          if ((pMVar34->indexType).id == 3) {
            bVar20 = ValidationInfo::shouldBeEqual<wasm::Expression*,wasm::Type>
                               ((ValidationInfo *)local_100,left,(Type)0x3,pEVar39,
                                "segment offset should be i64",(Function *)0x0);
          }
          else {
            bVar20 = ValidationInfo::shouldBeEqual<wasm::Expression*,wasm::Type>
                               ((ValidationInfo *)local_100,left,(Type)0x2,pEVar39,
                                "segment offset should be i32",(Function *)0x0);
          }
          if (bVar20 != false) {
            bVar20 = Properties::isValidConstantExpression
                               ((Module *)import,
                                *(Expression **)
                                 (*(long *)&(pFVar27->super_Importable).super_Named.name + 0x30));
            ValidationInfo::shouldBeTrue<wasm::Expression*>
                      ((ValidationInfo *)local_100,bVar20,
                       *(Expression **)
                        (*(long *)&(pFVar27->super_Importable).super_Named.name + 0x30),
                       "memory segment offset should be constant",(Function *)0x0);
            FunctionValidator::FunctionValidator
                      ((FunctionValidator *)&runner.skippedPasses._M_h._M_single_bucket,
                       (Module *)import,(ValidationInfo *)local_100);
            pp_Var41 = &runner.skippedPasses._M_h._M_single_bucket;
            FunctionValidator::validate
                      ((FunctionValidator *)pp_Var41,
                       *(Expression **)
                        (*(long *)&(pFVar27->super_Importable).super_Named.name + 0x30));
            FunctionValidator::~FunctionValidator((FunctionValidator *)pp_Var41);
            if ((pMVar34->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
              lVar33 = *(long *)&(pFVar27->super_Importable).super_Named.name;
              ValidationInfo::shouldBeTrue<unsigned_long>
                        ((ValidationInfo *)local_100,
                         (ulong)(lVar4 - lVar5) <= (pMVar34->initial).addr << 0x10,
                         *(long *)(lVar33 + 0x40) - *(long *)(lVar33 + 0x38),
                         "segment size should fit in memory (initial)",(Function *)0x0);
            }
          }
        }
      }
    }
    FunctionValidator::FunctionValidator
              ((FunctionValidator *)&runner.skippedPasses._M_h._M_single_bucket,(Module *)import,
               (ValidationInfo *)local_100);
    puVar19 = import;
    if (((ulong)puVar18[0x21]._M_t.
                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl & 0x100) == 0) {
      ValidationInfo::shouldBeTrue<char_const*>
                ((ValidationInfo *)local_100,
                 (ulong)((long)import[0x16]._M_t.
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl -
                        (long)import[0x15]._M_t.
                              super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                              .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl) < 9,
                 "table",
                 "Only 1 table definition allowed in MVP (requires --enable-reference-types)",
                 (Function *)0x0);
      local_48 = puVar19[0x15]._M_t.
                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                 super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if (local_48 !=
          puVar19[0x16]._M_t.
          super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
          super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
          super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl) {
        pp_Var6 = *(__buckets_ptr *)&(local_48->super_Importable).super_Named;
        wasm::Type::Type((Type *)&type,(HeapType)0x1,Nullable);
        ValidationInfo::shouldBeTrue<char_const*>
                  ((ValidationInfo *)local_100,pp_Var6[9] == (__node_base_ptr)type.id,"table",
                   "Only funcref is valid for table type (when reference types are disabled)",
                   (Function *)0x0);
        local_50 = import[0xd]._M_t.
                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        pFVar27 = import[0xc]._M_t.
                  super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        while (pFVar27 != local_50) {
          ValidationInfo::shouldBeTrue<char_const*>
                    ((ValidationInfo *)local_100,
                     (*(__buckets_ptr *)&(pFVar27->super_Importable).super_Named.name)[4] ==
                     ((__buckets_ptr)
                     (local_48->super_Importable).super_Named.name.super_IString.str._M_len)[1],
                     "elem","all element segments should refer to a single table in MVP.",
                     (Function *)0x0);
          pp_Var6 = *(__buckets_ptr *)&(pFVar27->super_Importable).super_Named.name;
          p_Var7 = pp_Var6[8];
          local_40 = pFVar27;
          for (p_Var46 = pp_Var6[7]; p_Var46 != p_Var7; p_Var46 = p_Var46 + 1) {
            pEVar39 = (Expression *)p_Var46->_M_nxt;
            ValidationInfo::shouldBeTrue<wasm::Expression*>
                      ((ValidationInfo *)local_100,pEVar39->_id == RefFuncId,pEVar39,
                       "all table elements must be non-null funcrefs in MVP.",(Function *)0x0);
            FunctionValidator::validate
                      ((FunctionValidator *)&runner.skippedPasses._M_h._M_single_bucket,pEVar39);
          }
          pFVar27 = (Function *)
                    &(local_40->super_Importable).super_Named.name.super_IString.str._M_str;
        }
      }
    }
    wasm::Type::Type((Type *)&type,(HeapType)0x0,Nullable);
    wasm::Type::Type((Type *)&stack0xfffffffffffffea8,(HeapType)0x1,Nullable);
    pFVar43 = import[0x16]._M_t.
              super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
              super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    for (pFVar27 = import[0x15]._M_t.
                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl; pFVar27 != pFVar43;
        pFVar27 = (Function *)((long)&(pFVar27->super_Importable).super_Named.name + 8)) {
      lVar33 = *(long *)&(pFVar27->super_Importable).super_Named.name;
      ValidationInfo::shouldBeTrue<char_const*>
                ((ValidationInfo *)local_100,*(ulong *)(lVar33 + 0x38) <= *(ulong *)(lVar33 + 0x40),
                 "table","size minimum must not be greater than maximum",(Function *)0x0);
      bVar20 = wasm::Type::isNullable
                         ((Type *)(*(long *)&(pFVar27->super_Importable).super_Named.name + 0x48));
      ValidationInfo::shouldBeTrue<char_const*>
                ((ValidationInfo *)local_100,bVar20,"table",
                 "Non-nullable reference types are not yet supported for tables",(Function *)0x0);
      uVar22 = *(uint *)&import[0x21]._M_t.
                         super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                         .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if ((uVar22 >> 10 & 1) == 0) {
        bVar20 = wasm::Type::isFunction
                           ((Type *)(*(long *)&(pFVar27->super_Importable).super_Named.name + 0x48))
        ;
        result = true;
        if (!bVar20) {
          result = *(uintptr_t *)(*(long *)&(pFVar27->super_Importable).super_Named.name + 0x48) ==
                   type.id;
        }
        ValidationInfo::shouldBeTrue<char_const*>
                  ((ValidationInfo *)local_100,result,"table",
                   "Only function reference types or externref are valid for table type (when GC is disabled)"
                   ,(Function *)0x0);
        uVar22 = *(uint *)&import[0x21]._M_t.
                           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                           .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      }
      if ((uVar22 >> 10 & 1) == 0) {
        pGVar3 = *(value_type *)(*(long *)&(pFVar27->super_Importable).super_Named.name + 0x48);
        ValidationInfo::shouldBeTrue<char_const*>
                  ((ValidationInfo *)local_100,
                   pGVar3 == (value_type)type.id || pGVar3 == (value_type)local_158._M_p,"table",
                   "Only funcref and externref are valid for table type (when gc is disabled)",
                   (Function *)0x0);
      }
    }
    local_40 = import[0xd]._M_t.
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    for (pFVar27 = import[0xc]._M_t.
                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl; pFVar27 != local_40;
        pFVar27 = (Function *)((long)&(pFVar27->super_Importable).super_Named.name + 8)) {
      bVar20 = wasm::Type::isRef((Type *)(*(long *)&(pFVar27->super_Importable).super_Named.name +
                                         0x30));
      ValidationInfo::shouldBeTrue<char_const*>
                ((ValidationInfo *)local_100,bVar20,"elem",
                 "element segment type must be of reference type.",(Function *)0x0);
      bVar20 = wasm::Type::isNullable
                         ((Type *)(*(long *)&(pFVar27->super_Importable).super_Named.name + 0x30));
      ValidationInfo::shouldBeTrue<char_const*>
                ((ValidationInfo *)local_100,bVar20,"elem",
                 "Non-nullable reference types are not yet supported for tables",(Function *)0x0);
      lVar33 = *(long *)&(pFVar27->super_Importable).super_Named.name;
      if (*(char **)(lVar33 + 0x20) == (char *)0x0) {
        ValidationInfo::shouldBeTrue<char_const*>
                  ((ValidationInfo *)local_100,*(long *)(lVar33 + 0x28) == 0,"elem",
                   "non-table segment offset should have no offset",(Function *)0x0);
      }
      else {
        name.super_IString.str._M_str = *(char **)(lVar33 + 0x20);
        name.super_IString.str._M_len = *(size_t *)(lVar33 + 0x18);
        pTVar35 = Module::getTableOrNull((Module *)import,name);
        ValidationInfo::shouldBeTrue<char_const*>
                  ((ValidationInfo *)local_100,pTVar35 != (Table *)0x0,"elem",
                   "element segment must have a valid table name",(Function *)0x0);
        ValidationInfo::shouldBeTrue<char_const*>
                  ((ValidationInfo *)local_100,
                   *(long *)(*(long *)&(pFVar27->super_Importable).super_Named.name + 0x28) != 0,
                   "elem","table segment offset should have an offset",(Function *)0x0);
        pEVar39 = *(Expression **)(*(long *)&(pFVar27->super_Importable).super_Named.name + 0x28);
        ValidationInfo::shouldBeEqual<wasm::Expression*,wasm::Type>
                  ((ValidationInfo *)local_100,(Type)(pEVar39->type).id,(Type)0x2,pEVar39,
                   "element segment offset should be i32",(Function *)0x0);
        bVar20 = Properties::isValidConstantExpression
                           ((Module *)import,
                            *(Expression **)
                             (*(long *)&(pFVar27->super_Importable).super_Named.name + 0x28));
        ValidationInfo::shouldBeTrue<wasm::Expression*>
                  ((ValidationInfo *)local_100,bVar20,
                   *(Expression **)(*(long *)&(pFVar27->super_Importable).super_Named.name + 0x28),
                   "table segment offset should be constant",(Function *)0x0);
        bVar20 = wasm::Type::isSubType
                           ((Type)*(uintptr_t *)
                                   (*(long *)&(pFVar27->super_Importable).super_Named.name + 0x30),
                            (Type)(pTVar35->type).id);
        ValidationInfo::shouldBeTrue<char_const*>
                  ((ValidationInfo *)local_100,bVar20,"elem",
                   "element segment type must be a subtype of the table type",(Function *)0x0);
        FunctionValidator::validate
                  ((FunctionValidator *)&runner.skippedPasses._M_h._M_single_bucket,
                   *(Expression **)(*(long *)&(pFVar27->super_Importable).super_Named.name + 0x28));
      }
      lVar33 = *(long *)&(pFVar27->super_Importable).super_Named.name;
      puVar8 = *(undefined8 **)(lVar33 + 0x40);
      for (puVar44 = *(undefined8 **)(lVar33 + 0x38); puVar44 != puVar8; puVar44 = puVar44 + 1) {
        pEVar39 = (Expression *)*puVar44;
        bVar20 = Properties::isValidConstantExpression((Module *)import,pEVar39);
        ValidationInfo::shouldBeTrue<wasm::Expression*>
                  ((ValidationInfo *)local_100,bVar20,pEVar39,
                   "element must be a constant expression",(Function *)0x0);
        ValidationInfo::shouldBeSubType
                  ((ValidationInfo *)local_100,(Type)(pEVar39->type).id,
                   (Type)*(uintptr_t *)
                          (*(long *)&(pFVar27->super_Importable).super_Named.name + 0x30),pEVar39,
                   "element must be a subtype of the segment type",(Function *)0x0);
        FunctionValidator::validate
                  ((FunctionValidator *)&runner.skippedPasses._M_h._M_single_bucket,pEVar39);
      }
    }
    FunctionValidator::~FunctionValidator
              ((FunctionValidator *)&runner.skippedPasses._M_h._M_single_bucket);
    puVar18 = import;
    pFVar27 = import[9]._M_t.
              super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
              super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    pFVar43 = pFVar27;
    if (pFVar27 !=
        import[10]._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
        _M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
        super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl) {
      ValidationInfo::shouldBeTrue<wasm::Name>
                ((ValidationInfo *)local_100,
                 SUB41((*(uint *)&import[0x21]._M_t.
                                  super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                  .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl &
                       0x40) >> 6,0),
                 (Name)*(string_view *)
                        *(__uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_> *)
                         &(pFVar27->super_Importable).super_Named,
                 "Tags require exception-handling [--enable-exception-handling]",(Function *)0x0);
      pFVar27 = puVar18[9]._M_t.
                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      pFVar43 = puVar18[10]._M_t.
                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    }
    local_40 = pFVar43;
    for (; module = (Module *)import, pFVar27 != local_40;
        pFVar27 = (Function *)&(pFVar27->super_Importable).super_Named.name.super_IString.str._M_str
        ) {
      pFVar43 = (Function *)(pFVar27->super_Importable).super_Named.name.super_IString.str._M_len;
      ValidationInfo::shouldBeEqual<wasm::Name,wasm::Type>
                ((ValidationInfo *)local_100,(Type)*(uintptr_t *)&pFVar43->profile,(Type)0x0,
                 (IString)*(IString *)&(pFVar43->super_Importable).super_Named,
                 "Tag type\'s result type should be none",(Function *)0x0);
      bVar20 = wasm::Type::isTuple((Type *)&((Function *)
                                            (pFVar27->super_Importable).super_Named.name.
                                            super_IString.str._M_len)->type);
      if (bVar20) {
        ValidationInfo::shouldBeTrue<wasm::Name>
                  ((ValidationInfo *)local_100,
                   (bool)((byte)(*(uint *)&import[0x21]._M_t.
                                           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                           .super__Head_base<0UL,_wasm::Function_*,_false>.
                                           _M_head_impl >> 9) & 1),
                   (IString)*(IString *)
                             &(((Function *)
                               (pFVar27->super_Importable).super_Named.name.super_IString.str._M_len
                               )->super_Importable).super_Named,
                   "Multivalue tag type requires multivalue [--enable-multivalue]",(Function *)0x0);
      }
      runner.skippedPasses._M_h._M_single_bucket =
           (__node_base_ptr)
           &((Function *)(pFVar27->super_Importable).super_Named.name.super_IString.str._M_len)->
            type;
      __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)0x0;
      PVar49 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
               wasm::Type::end((Type *)runner.skippedPasses._M_h._M_single_bucket);
      for (; PVar17.index = (size_t)__begin3.
                                    super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                    .parent,
          PVar17.parent = (Type *)runner.skippedPasses._M_h._M_single_bucket, PVar49 != PVar17;
          __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)((long)&(__begin3.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               parent)->id + 1)) {
        pTVar24 = wasm::Type::Iterator::operator*
                            ((Iterator *)&runner.skippedPasses._M_h._M_single_bucket);
        ValidationInfo::shouldBeTrue<wasm::Name>
                  ((ValidationInfo *)local_100,1 < pTVar24->id,
                   (IString)*(IString *)
                             &(((Function *)
                               (pFVar27->super_Importable).super_Named.name.super_IString.str._M_len
                               )->super_Importable).super_Named,
                   "Values in a tag should have concrete types",(Function *)0x0);
      }
    }
    pFVar27 = import[0x19]._M_t.
              super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
              super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    if (pFVar27 != (Function *)0x0) {
      name_00.super_IString.str._M_str = (char *)pFVar27;
      name_00.super_IString.str._M_len =
           (size_t)import[0x18]._M_t.
                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      pFVar27 = Module::getFunctionOrNull((Module *)import,name_00);
      bVar20 = ValidationInfo::shouldBeTrue<wasm::Name>
                         ((ValidationInfo *)local_100,pFVar27 != (Function *)0x0,
                          (IString)*(IString *)
                                    &((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
                                       *)((long)module + 0xc0))->_M_t,"start must be found",
                          (Function *)0x0);
      if (bVar20) {
        SVar48 = HeapType::getSignature(&pFVar27->type);
        ValidationInfo::shouldBeTrue<wasm::Name>
                  ((ValidationInfo *)local_100,SVar48.params.id.id == 0,
                   (IString)*(IString *)
                             &((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                              ((long)module + 0xc0))->_M_t,"start must have 0 params",
                   (Function *)0x0);
        SVar48 = HeapType::getSignature(&pFVar27->type);
        ValidationInfo::shouldBeTrue<wasm::Name>
                  ((ValidationInfo *)local_100,SVar48.results.id.id == 0,
                   (IString)*(IString *)
                             &((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                              ((long)module + 0xc0))->_M_t,"start must not return a value",
                   (Function *)0x0);
      }
    }
    FVar21.features =
         *(uint32_t *)
          &(((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
            ((long)module + 0x108))->_M_t).
           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
           super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    if ((FVar21.features >> 10 & 1) != 0) {
      ValidationInfo::shouldBeTrue<wasm::FeatureSet>
                ((ValidationInfo *)local_100,(bool)((byte)(FVar21.features >> 8) & 1),FVar21,
                 "--enable-gc requires --enable-reference-types",(Function *)0x0);
    }
    if (info.wasm._3_1_ == 1) {
      runner.skippedPasses._M_h._M_single_bucket = a_Stack_358;
      a_Stack_358[0]._M_nxt = (_Hash_node_base *)0x0;
      pFVar43 = (((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                 ((long)module + 0x20))->_M_t).
                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      for (pFVar27 = (((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                      ((long)module + 0x18))->_M_t).
                     super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl; pFVar27 != pFVar43
          ; pFVar27 = (Function *)((long)&(pFVar27->super_Importable).super_Named.name + 8)) {
        lVar33 = *(long *)&(pFVar27->super_Importable).super_Named.name;
        if (*(long *)(lVar33 + 0x20) != 0) {
          std::__detail::
          _Insert_base<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::insert((_Insert_base<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    *)&runner.skippedPasses._M_h._M_single_bucket,(value_type *)(lVar33 + 0x38));
        }
      }
      pFVar43 = import[1]._M_t.
                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      for (pFVar27 = (import->_M_t).
                     super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl; puVar18 = import,
          pFVar27 != pFVar43;
          pFVar27 = (Function *)((long)&(pFVar27->super_Importable).super_Named.name + 8)) {
        lVar33 = *(long *)&(pFVar27->super_Importable).super_Named.name;
        if (*(int *)(lVar33 + 0x20) == 0) {
          pFVar36 = Module::getFunction((Module *)import,(Name)((IString *)(lVar33 + 0x10))->str);
          std::__detail::
          _Insert_base<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::insert((_Insert_base<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    *)&runner.skippedPasses._M_h._M_single_bucket,&pFVar36->type);
        }
      }
      wasm::ModuleUtils::getPublicHeapTypes
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&local_118,
                 (Module *)import);
      local_40 = (Function *)(puVar18 + 0x24);
      __k = &info.outputs._M_h._M_single_bucket;
      local_48 = (Function *)local_118._M_impl.super__Vector_impl_data._M_finish;
      pFVar43 = (Function *)local_118._M_impl.super__Vector_impl_data._M_finish;
      for (pFVar27 = (Function *)local_118._M_impl.super__Vector_impl_data._M_start;
          pFVar27 != pFVar43;
          pFVar27 = (Function *)
                    &(pFVar27->super_Importable).super_Named.name.super_IString.str._M_str) {
        info.outputs._M_h._M_single_bucket =
             (__node_base_ptr)(pFVar27->super_Importable).super_Named.name.super_IString.str._M_len;
        sVar37 = std::
                 _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::count((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)&runner.skippedPasses._M_h._M_single_bucket,(key_type *)__k);
        if (sVar37 == 0) {
          HeapType::toString_abi_cxx11_((string *)&type,(HeapType *)__k);
          iVar38 = std::
                   _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)local_40,(key_type *)__k);
          if (iVar38.
              super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>.
              _M_cur != (__node_type *)0x0) {
            IString::toString_abi_cxx11_
                      ((string *)&stack0xfffffffffffffea8,
                       (IString *)
                       ((long)iVar38.
                              super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                              ._M_cur + 0x10));
            std::__cxx11::string::operator=((string *)&type,(string *)&stack0xfffffffffffffea8);
            std::__cxx11::string::~string((string *)&stack0xfffffffffffffea8);
            pFVar43 = local_48;
          }
          std::operator+(&local_138,"publicly exposed type disallowed with a closed world: $",
                         (string *)&type);
          ValidationInfo::fail<wasm::HeapType,std::__cxx11::string>
                    ((ValidationInfo *)local_100,&local_138,
                     (HeapType)info.outputs._M_h._M_single_bucket,(Function *)0x0);
          std::__cxx11::string::~string((string *)&local_138);
          std::__cxx11::string::~string((string *)&type);
        }
      }
      std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base(&local_118);
      std::
      _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)&runner.skippedPasses._M_h._M_single_bucket);
      module = (Module *)import;
    }
  }
  iVar23 = PassRunner::getPassDebug();
  if (iVar23 != 0) {
    local_2a8 = aTStack_278;
    runner.skippedPasses._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_2d8 = 0;
    uStack_2d0 = 0;
    local_2c8 = 0;
    lStack_2c0 = 0;
    local_2b0 = local_100;
    local_2a0 = 1;
    local_298 = 0;
    uStack_290 = 0;
    local_288 = 0x3f800000;
    local_280 = 0;
    aTStack_278[0].func = (TaskFunc)0x0;
    puVar9 = (module->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_2b8 = module;
    for (puVar47 = (module->globals).
                   super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar47 != puVar9;
        puVar47 = puVar47 + 1) {
      pGVar28 = (puVar47->_M_t).
                super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if (*(char **)((long)&(pGVar28->super_Importable).module + 8) == (char *)0x0) {
        Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
        walk((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)&runner.skippedPasses._M_h._M_single_bucket,&pGVar28->init);
      }
    }
    pFVar43 = import[4]._M_t.
              super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
              super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    for (pFVar27 = import[3]._M_t.
                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl; pFVar27 != pFVar43;
        pFVar27 = (Function *)((long)&(pFVar27->super_Importable).super_Named.name + 8)) {
      lVar33 = *(long *)&(pFVar27->super_Importable).super_Named.name;
      if (*(long *)(lVar33 + 0x20) == 0) {
        lStack_2c0 = lVar33;
        Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
        walk((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)&runner.skippedPasses._M_h._M_single_bucket,(Expression **)(lVar33 + 0x60));
        lStack_2c0 = 0;
      }
    }
    local_40 = import[0xd]._M_t.
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    pp_Var41 = &runner.skippedPasses._M_h._M_single_bucket;
    for (pFVar27 = import[0xc]._M_t.
                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl; pFVar27 != local_40;
        pFVar27 = (Function *)((long)&(pFVar27->super_Importable).super_Named.name + 8)) {
      _Var2._M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
      super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
           *(tuple<wasm::Function_*,_std::default_delete<wasm::Function>_> *)
            &(pFVar27->super_Importable).super_Named.name;
      if (*(long *)((long)_Var2._M_t.
                          super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                          .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x20) != 0)
      {
        Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
        walk((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)pp_Var41,
             (Expression **)
             ((long)_Var2._M_t.
                    super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x28));
      }
      puVar10 = *(uintptr_t **)
                 ((long)_Var2._M_t.
                        super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                        .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x40);
      for (puVar45 = *(uintptr_t **)
                      ((long)_Var2._M_t.
                             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                             .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x38);
          puVar45 != puVar10; puVar45 = puVar45 + 1) {
        type.id = *puVar45;
        Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
        walk((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)pp_Var41,(Expression **)&type);
      }
    }
    pFVar43 = import[0x13]._M_t.
              super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
              super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    for (pFVar27 = import[0x12]._M_t.
                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl; pFVar27 != pFVar43;
        pFVar27 = (Function *)((long)&(pFVar27->super_Importable).super_Named.name + 8)) {
      lVar33 = *(long *)&(pFVar27->super_Importable).super_Named.name;
      if (*(char *)(lVar33 + 0x28) == '\0') {
        Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
        walk((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
              *)&runner.skippedPasses._M_h._M_single_bucket,(Expression **)(lVar33 + 0x30));
      }
    }
    local_2b8 = (Module *)0x0;
    anon_func::BinaryenIRValidator::~BinaryenIRValidator
              ((BinaryenIRValidator *)&runner.skippedPasses._M_h._M_single_bucket);
    module = (Module *)import;
  }
  if (((info.wasm._4_1_ & 1) == 0) && (info.wasm._2_1_ == 0)) {
    puVar11 = (module->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pp_Var41 = &runner.skippedPasses._M_h._M_single_bucket;
    for (puVar42 = (module->functions).
                   super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar42 != puVar11;
        puVar42 = puVar42 + 1) {
      ValidationInfo::getStream_abi_cxx11_
                ((ValidationInfo *)local_100,
                 (puVar42->_M_t).
                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                 super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
      std::__cxx11::stringbuf::str();
      std::operator<<((ostream *)&std::cerr,(string *)pp_Var41);
      std::__cxx11::string::~string((string *)pp_Var41);
    }
    ValidationInfo::getStream_abi_cxx11_((ValidationInfo *)local_100,(Function *)0x0);
    std::__cxx11::stringbuf::str();
    std::operator<<((ostream *)&std::cerr,(string *)&runner.skippedPasses._M_h._M_single_bucket);
    std::__cxx11::string::~string((string *)&runner.skippedPasses._M_h._M_single_bucket);
  }
  bVar12 = info.wasm._4_1_;
  PassRunner::~PassRunner((PassRunner *)local_4a0);
  std::
  _Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<wasm::Function_*const,_std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<wasm::Function_*const,_std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&info.mutex.super___mutex_base._M_mutex.__data.__list.__next);
  return (bool)(bVar12 & 1);
}

Assistant:

bool WasmValidator::validate(Module& module, Flags flags) {
  ValidationInfo info(module);
  info.validateWeb = (flags & Web) != 0;
  info.validateGlobally = (flags & Globally) != 0;
  info.quiet = (flags & Quiet) != 0;
  info.closedWorld = (flags & ClosedWorld) != 0;
  // parallel wasm logic validation
  PassRunner runner(&module);
  FunctionValidator(module, &info).validate(&runner);
  // validate globally
  if (info.validateGlobally) {
    validateImports(module, info);
    validateExports(module, info);
    validateGlobals(module, info);
    validateMemories(module, info);
    validateDataSegments(module, info);
    validateTables(module, info);
    validateTags(module, info);
    validateModule(module, info);
    validateFeatures(module, info);
    if (info.closedWorld) {
      validateClosedWorldInterface(module, info);
    }
  }
  // validate additional internal IR details when in pass-debug mode
  if (PassRunner::getPassDebug()) {
    validateBinaryenIR(module, info);
  }
  // print all the data
  if (!info.valid.load() && !info.quiet) {
    for (auto& func : module.functions) {
      std::cerr << info.getStream(func.get()).str();
    }
    std::cerr << info.getStream(nullptr).str();
  }
  return info.valid.load();
}